

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result_interface.h
# Opt level: O0

return_type_conflict * __thiscall
ezy::features::result_interface<ezy::features::result_adapter>::
impl<ezy::strong_type<std::variant<int,int>,void,ezy::features::result_like_continuation>>::
and_then<____C_A_T_C_H____T_E_S_T____28()::__24&>
          (return_type_conflict *__return_storage_ptr__,void *this,anon_class_1_0_00000001 *fn)

{
  return_type_conflict *prVar1;
  anon_class_1_0_00000001 *in_RCX;
  anon_class_1_0_00000001 *fn_local;
  impl<ezy::strong_type<std::variant<int,_int>,_void,_ezy::features::result_like_continuation>_>
  *this_local;
  
  prVar1 = _impl::
           and_then<ezy::strong_type<std::variant<int,int>,void,ezy::features::result_like_continuation>,____C_A_T_C_H____T_E_S_T____28()::__24&>
                     (__return_storage_ptr__,(_impl *)this,
                      (strong_type<std::variant<int,_int>,_void,_ezy::features::result_like_continuation>
                       *)fn,in_RCX);
  return prVar1;
}

Assistant:

constexpr decltype(auto) and_then(Fn&& fn) &&
      {
        return _impl::and_then(static_cast<T&&>(*this), std::forward<Fn>(fn));
      }